

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult *
iutest::internal::CmpHelperFloatingPointComplexEQ<double>
          (AssertionResult *__return_storage_ptr__,char *expr1,char *expr2,complex<double> *val1,
          complex<double> *val2)

{
  bool bVar1;
  complex<double> *pcVar2;
  double dVar3;
  bool local_e1;
  string local_e0;
  string local_c0;
  string local_90;
  string local_70;
  floating_point<double> local_50;
  floating_point<double> imag2;
  floating_point<double> imag1;
  floating_point<double> real2;
  floating_point<double> real1;
  complex<double> *val2_local;
  complex<double> *val1_local;
  char *expr2_local;
  char *expr1_local;
  
  pcVar2 = val1;
  dVar3 = std::complex<double>::real_abi_cxx11_(val1);
  floating_point<double>::floating_point(&real2,dVar3);
  dVar3 = std::complex<double>::real_abi_cxx11_(val2);
  floating_point<double>::floating_point(&imag1,dVar3);
  dVar3 = std::complex<double>::imag_abi_cxx11_(val1);
  floating_point<double>::floating_point(&imag2,dVar3);
  dVar3 = std::complex<double>::imag_abi_cxx11_(val2);
  floating_point<double>::floating_point(&local_50,dVar3);
  bVar1 = floating_point<double>::AlmostEquals(&real2,&imag1);
  pcVar2 = (complex<double> *)CONCAT71((int7)((ulong)pcVar2 >> 8),bVar1);
  local_e1 = false;
  if (bVar1) {
    local_e1 = floating_point<double>::AlmostEquals(&imag2,&local_50);
  }
  if (local_e1 == false) {
    FormatForComparisonFailureMessage<std::complex<double>,std::complex<double>>
              (&local_90,(internal *)val1,val2,pcVar2);
    detail::ShowStringQuoted(&local_70,&local_90);
    FormatForComparisonFailureMessage<std::complex<double>,std::complex<double>>
              (&local_e0,(internal *)val2,val1,pcVar2);
    detail::ShowStringQuoted(&local_c0,&local_e0);
    EqFailure(__return_storage_ptr__,expr1,expr2,&local_70,&local_c0,false);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    AssertionSuccess();
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult CmpHelperFloatingPointComplexEQ(const char* expr1, const char* expr2
                                                , const ::std::complex<RawType>& val1, const ::std::complex<RawType>& val2)
{
    floating_point<RawType> real1(val1.real()), real2(val2.real());
    floating_point<RawType> imag1(val1.imag()), imag2(val2.imag());
    if IUTEST_COND_LIKELY( real1.AlmostEquals(real2) && imag1.AlmostEquals(imag2) )
    {
        return AssertionSuccess();
    }